

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::torrent::post_file_progress(torrent *this,file_progress_flags_t flags)

{
  _Atomic_word *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  vector<std::int64_t,_file_index_t> fp;
  vector<std::int64_t,_file_index_t> local_48;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> local_28;
  
  local_48.super_vector<long,_std::allocator<long>_>.super__Vector_base<long,_std::allocator<long>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super_vector<long,_std::allocator<long>_>.super__Vector_base<long,_std::allocator<long>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super_vector<long,_std::allocator<long>_>.super__Vector_base<long,_std::allocator<long>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  file_progress(this,&local_48,flags);
  iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  get_handle((torrent *)&stack0xffffffffffffffd0);
  alert_manager::
  emplace_alert<libtorrent::file_progress_alert,libtorrent::torrent_handle,libtorrent::aux::container_wrapper<long,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<long,std::allocator<long>>>>
            ((alert_manager *)CONCAT44(extraout_var,iVar2),
             (torrent_handle *)&stack0xffffffffffffffd0,&local_48);
  if (local_28._M_head_impl != (piece_picker *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._M_head_impl)->
                _M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._M_head_impl)->_M_weak_count
      ;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._M_head_impl)->_M_weak_count =
           iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._M_head_impl)->
        _vptr__Sp_counted_base[3])();
    }
  }
  if (local_48.super_vector<long,_std::allocator<long>_>.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_48.super_vector<long,_std::allocator<long>_>.
                    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_48.super_vector<long,_std::allocator<long>_>.
                                   super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_48.super_vector<long,_std::allocator<long>_>.
                                   super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void torrent::post_file_progress(file_progress_flags_t const flags)
	{
		aux::vector<std::int64_t, file_index_t> fp;
		file_progress(fp, flags);
		alerts().emplace_alert<file_progress_alert>(get_handle(), std::move(fp));
	}